

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O2

bool __thiscall ON_Matrix::Add(ON_Matrix *this,ON_Matrix *a,ON_Matrix *b)

{
  int col_count;
  uint uVar1;
  double **ppdVar2;
  double **ppdVar3;
  double **ppdVar4;
  bool bVar5;
  int iVar6;
  double ***pppdVar7;
  ulong uVar8;
  int row_count;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  col_count = a->m_col_count;
  if (col_count == b->m_col_count) {
    bVar5 = false;
    if (((0 < col_count) && (row_count = a->m_row_count, bVar5 = false, 0 < row_count)) &&
       (bVar5 = false, row_count == b->m_row_count)) {
      iVar6 = row_count;
      if (this != b && this != a) {
        Create(this,row_count,col_count);
        row_count = b->m_row_count;
        iVar6 = a->m_row_count;
      }
      pppdVar7 = &a->m;
      if (iVar6 == (a->m_rowmem).m_count) {
        pppdVar7 = &(a->m_rowmem).m_a;
      }
      ppdVar2 = *pppdVar7;
      pppdVar7 = &b->m;
      if (row_count == (b->m_rowmem).m_count) {
        pppdVar7 = &(b->m_rowmem).m_a;
      }
      ppdVar3 = *pppdVar7;
      uVar1 = this->m_row_count;
      pppdVar7 = &this->m;
      if (uVar1 == (this->m_rowmem).m_count) {
        pppdVar7 = &(this->m_rowmem).m_a;
      }
      uVar10 = 0;
      uVar9 = (ulong)(uint)this->m_col_count;
      if (this->m_col_count < 1) {
        uVar9 = uVar10;
      }
      ppdVar4 = *pppdVar7;
      uVar8 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar8 = uVar10;
      }
      for (; uVar10 != uVar8; uVar10 = uVar10 + 1) {
        for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
          ppdVar4[uVar10][uVar11] = ppdVar2[uVar10][uVar11] + ppdVar3[uVar10][uVar11];
        }
      }
      bVar5 = true;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ON_Matrix::Add( const ON_Matrix& a, const ON_Matrix& b )
{
  int i, j;
  if (a.ColCount() != b.ColCount() )
    return false;
  if (a.RowCount() != b.RowCount() )
    return false;
  if ( a.RowCount() < 1 || a.ColCount() < 1 )
    return false;
  if ( this != &a && this != &b ) {
    Create( a.RowCount(), b.ColCount() );
  }
  double const*const* am = a.ThisM();
  double const*const* bm = b.ThisM();
  double** this_m = ThisM();
  for ( i = 0; i < m_row_count; i++ ) for ( j = 0; j < m_col_count; j++ ) {
    this_m[i][j] = am[i][j] + bm[i][j];
  }
  return true;  
}